

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O0

void __thiscall ON_HermiteSurface::ON_HermiteSurface(ON_HermiteSurface *this)

{
  ON_HermiteSurface *this_local;
  
  this->m_u_count = 0;
  this->m_v_count = 0;
  ON_SimpleArray<double>::ON_SimpleArray(&this->m_u_parameters);
  ON_SimpleArray<double>::ON_SimpleArray(&this->m_v_parameters);
  ON_ClassArray<ON_SimpleArray<ON_3dPoint>_>::ON_ClassArray(&this->m_grid_points);
  ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::ON_ClassArray(&this->m_u_tangents);
  ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::ON_ClassArray(&this->m_v_tangents);
  ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::ON_ClassArray(&this->m_twists);
  return;
}

Assistant:

ON_HermiteSurface::ON_HermiteSurface()
  : m_u_count(0)
  , m_v_count(0)
{
}